

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

void duckdb::GenerateUUIDv4Function(DataChunk *args,ExpressionState *state,Vector *result)

{
  optional_ptr<duckdb::FunctionLocalState,_true> oVar1;
  Vector *this;
  RandomEngine *engine;
  idx_t iVar2;
  uint64_t *puVar3;
  DataChunk *in_RDI;
  hugeint_t hVar4;
  idx_t i;
  hugeint_t *result_data;
  RandomLocalState *lstate;
  ExpressionState *in_stack_ffffffffffffffa8;
  FunctionLocalState *in_stack_ffffffffffffffb0;
  ulong uVar5;
  uint64_t local_48;
  int64_t local_40;
  ulong local_38;
  VectorType vector_type_p;
  
  oVar1 = ExecuteFunctionState::GetFunctionState(in_stack_ffffffffffffffa8);
  vector_type_p = (VectorType)((ulong)oVar1.ptr >> 0x38);
  optional_ptr<duckdb::FunctionLocalState,_true>::operator->
            ((optional_ptr<duckdb::FunctionLocalState,_true> *)in_stack_ffffffffffffffb0);
  this = (Vector *)FunctionLocalState::Cast<duckdb::RandomLocalState>(in_stack_ffffffffffffffb0);
  Vector::SetVectorType(this,vector_type_p);
  engine = (RandomEngine *)FlatVector::GetData<duckdb::hugeint_t>((Vector *)0x213833f);
  local_38 = 0;
  while( true ) {
    uVar5 = local_38;
    iVar2 = DataChunk::size(in_RDI);
    if (iVar2 <= uVar5) break;
    hVar4 = UUID::GenerateRandomUUID(engine);
    puVar3 = (uint64_t *)((long)&(engine->lock).super___mutex_base._M_mutex + local_38 * 0x10);
    local_48 = hVar4.lower;
    *puVar3 = local_48;
    local_40 = hVar4.upper;
    puVar3[1] = local_40;
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

static void GenerateUUIDv4Function(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 0);
	auto &lstate = ExecuteFunctionState::GetFunctionState(state)->Cast<RandomLocalState>();

	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto result_data = FlatVector::GetData<hugeint_t>(result);

	for (idx_t i = 0; i < args.size(); i++) {
		result_data[i] = UUIDv4::GenerateRandomUUID(lstate.random_engine);
	}
}